

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O1

void __thiscall
bloaty::RangeMap::
CheckConsistency<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
          (RangeMap *this,
          _Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> iter)

{
  const_iterator iter_00;
  uint64_t uVar1;
  undefined1 *puVar2;
  long lVar3;
  
  if ((long)&(iter._M_node[2]._M_parent)->_M_color + *(ulong *)(iter._M_node + 1) <=
      *(ulong *)(iter._M_node + 1)) {
    __assert_fail("iter->first + iter->second.size > iter->first",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                  ,0xb5,
                  "void bloaty::RangeMap::CheckConsistency(T) const [T = std::_Rb_tree_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                 );
  }
  if ((this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left != iter._M_node) {
    iter_00._M_node = (_Base_ptr)std::_Rb_tree_decrement(iter._M_node);
    uVar1 = RangeEndUnknownLimit(this,iter_00,0xffffffffffffffff);
    if (*(ulong *)(iter._M_node + 1) < uVar1) {
      __assert_fail("iter == mappings_.begin() || RangeEnd(std::prev(iter)) <= iter->first",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                    ,0xb7,
                    "void bloaty::RangeMap::CheckConsistency(T) const [T = std::_Rb_tree_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                   );
    }
  }
  puVar2 = (undefined1 *)std::_Rb_tree_increment(iter._M_node);
  if ((_Rb_tree_header *)puVar2 != &(this->mappings_)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = RangeEndUnknownLimit(this,(const_iterator)iter._M_node,0xffffffffffffffff);
    lVar3 = std::_Rb_tree_increment(iter._M_node);
    if (*(ulong *)(lVar3 + 0x20) < uVar1) {
      __assert_fail("std::next(iter) == mappings_.end() || RangeEnd(iter) <= std::next(iter)->first"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                    ,0xb9,
                    "void bloaty::RangeMap::CheckConsistency(T) const [T = std::_Rb_tree_iterator<std::pair<const unsigned long, bloaty::RangeMap::Entry>>]"
                   );
    }
  }
  return;
}

Assistant:

void CheckConsistency(T iter) const {
    assert(iter->first + iter->second.size > iter->first);
    assert(iter == mappings_.begin() ||
           RangeEnd(std::prev(iter)) <= iter->first);
    assert(std::next(iter) == mappings_.end() ||
           RangeEnd(iter) <= std::next(iter)->first);
  }